

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O2

void sig_child_handler(void)

{
  logdir *plVar1;
  int iVar2;
  long lVar3;
  logdir *plVar4;
  
  if (verbose != 0) {
    strerr_warn("svlogd: info: ","sigchild received.",(char *)0x0,(char *)0x0,(char *)0x0,
                (char *)0x0,(strerr *)0x0);
  }
LAB_00104f0c:
  do {
    iVar2 = wait_nohang(&wstat);
    if (iVar2 < 1) {
      return;
    }
    lVar3 = (ulong)dirn + 1;
    plVar1 = dir + -1;
    do {
      plVar4 = plVar1;
      lVar3 = lVar3 + -1;
      if (lVar3 == 0) goto LAB_00104f0c;
      plVar1 = plVar4 + 1;
    } while (plVar4[1].ppid != iVar2);
    plVar4[1].ppid = 0;
    processorstop(plVar4 + 1);
  } while( true );
}

Assistant:

void sig_child_handler(void) {
  int pid, l;

  if (verbose) strerr_warn2(INFO, "sigchild received.", 0);
  while ((pid =wait_nohang(&wstat)) > 0)
    for (l =0; l < dirn; ++l)
      if (dir[l].ppid == pid) {
        dir[l].ppid =0;
        processorstop(&dir[l]);
        break;
      }
}